

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O0

void read_agency(agency_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  agency_t *record_local;
  
  init_agency(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"agency_id");
    if (iVar1 == 0) {
      strcpy(record->id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"agency_name");
      if (iVar1 == 0) {
        strcpy(record->name,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"agency_url");
        if (iVar1 == 0) {
          strcpy(record->url,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"agency_timezone");
          if (iVar1 == 0) {
            strcpy(record->timezone,field_values[local_2c]);
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"agency_lang");
            if (iVar1 == 0) {
              strcpy(record->lang,field_values[local_2c]);
            }
            else {
              iVar1 = strcmp(field_names[local_2c],"agency_phone");
              if (iVar1 == 0) {
                strcpy(record->phone,field_values[local_2c]);
              }
              else {
                iVar1 = strcmp(field_names[local_2c],"agency_fare_url");
                if (iVar1 == 0) {
                  strcpy(record->fare_url,field_values[local_2c]);
                }
                else {
                  iVar1 = strcmp(field_names[local_2c],"agency_email");
                  if (iVar1 == 0) {
                    strcpy(record->email,field_values[local_2c]);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_agency(agency_t *record, int field_count, const char **field_names, const char **field_values) {
    init_agency(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_url") == 0) {
            strcpy(record->url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_timezone") == 0) {
            strcpy(record->timezone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_lang") == 0) {
            strcpy(record->lang, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_phone") == 0) {
            strcpy(record->phone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_fare_url") == 0) {
            strcpy(record->fare_url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_email") == 0) {
            strcpy(record->email, field_values[i]);
            continue;
        }
    }
}